

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  LameWrapper *pLVar1;
  pointer pcVar2;
  pointer ppLVar3;
  int iVar4;
  long lVar5;
  ostream *poVar6;
  long *plVar7;
  long lVar8;
  pointer ppLVar9;
  int iVar10;
  Options options;
  vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> lw;
  string workDir;
  Options local_c0;
  vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> local_b8;
  char *local_98;
  long local_90;
  char local_88 [16];
  char *local_78;
  long local_70;
  char local_68 [16];
  long local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  lVar5 = std::chrono::_V2::system_clock::now();
  cinemo::args::printCopyrights();
  local_c0.help = false;
  local_c0.verbose = false;
  local_c0.noThread = false;
  local_c0.quality = 3;
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  local_b8.super__Vector_base<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar4 = cinemo::args::processArgs(argc,argv,&local_c0,&local_b8);
  if (iVar4 < 1) {
    if (local_b8.super__Vector_base<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_b8.super__Vector_base<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      iVar4 = 0;
    }
    else {
      if (local_c0.noThread == false) {
        cinemo::threading::doMultiThreadedConversion(&local_b8,&local_c0);
      }
      else {
        cinemo::threading::doSingleThreadedConversion(&local_b8,&local_c0);
      }
      ppLVar3 = local_b8.
                super__Vector_base<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      iVar10 = 0;
      iVar4 = 0;
      local_58 = lVar5;
      for (ppLVar9 = local_b8.
                     super__Vector_base<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppLVar9 != ppLVar3;
          ppLVar9 = ppLVar9 + 1) {
        pLVar1 = *ppLVar9;
        if (pLVar1->isDone == true) {
          iVar10 = iVar10 + 1;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Error: \'",8);
          local_78 = local_68;
          pcVar2 = (pLVar1->file)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_78,pcVar2,pcVar2 + (pLVar1->file)._M_string_length);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_78,local_70);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\' ",2);
          local_98 = local_88;
          pcVar2 = (pLVar1->message_buffer)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_98,pcVar2,pcVar2 + (pLVar1->message_buffer)._M_string_length);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_98,local_90);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          if (local_98 != local_88) {
            operator_delete(local_98);
          }
          if (local_78 != local_68) {
            operator_delete(local_78);
          }
          iVar4 = iVar4 + 1;
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"-------------------------------------",0x25);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nConversion Report:\n",0x14);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nConverted:\t",0xc)
      ;
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\nSkipped:\t",10);
      plVar7 = (long *)std::ostream::operator<<((ostream *)poVar6,iVar4);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      std::ostream::flush();
      lVar8 = std::chrono::_V2::system_clock::now();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Runtime:\t",9);
      lVar5 = std::cout;
      *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
      *(undefined8 *)(operator_delete__ + *(long *)(lVar5 + -0x18)) = 3;
      poVar6 = std::ostream::_M_insert<double>((double)((lVar8 - local_58) / 1000000) / 1000.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"s\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"-------------------------------------",0x25);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      iVar4 = 0;
    }
  }
  if (local_b8.super__Vector_base<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.
                    super__Vector_base<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return iVar4;
}

Assistant:

int main(int argc, char* argv[]) {

	//Time measurement
	auto startTime = std::chrono::system_clock::now();

    args::printCopyrights();
    args::Options options;
    string workDir;
    vector<LameWrapper*> lw;

    int retVal = args::processArgs(argc, argv, options, lw);

    if (retVal > 0) { //error in arguments
        return retVal;
    }

    if (lw.size() == 0) { //no file to work on!
        return 0;
    }

    //Do the work
    if (!options.noThread) {
        threading::doMultiThreadedConversion(lw, options);
    } else { //single thread mode for comparison with -n switch
        threading::doSingleThreadedConversion(lw, options);
    }

	//write encoding results
	//TODO better to be moved into threading.cpp 
	int success = 0, failure = 0;
	for_each(begin(lw), end(lw), [&](const LameWrapper* item) {
		if (item->isFinished())
			success++;
		else {
			failure++;
			cout << "Error: '" << item->getFileName() << "' "
				<< item->getErrorMessage() << endl;
		}
	});

	cout << "-------------------------------------" 
		<< "\nConversion Report:\n"
		<< "\nConverted:\t" << success 
		<< "\nSkipped:\t" << failure << endl;

	//calculate and print total runtime
	auto elapsed = std::chrono::duration_cast<std::chrono::milliseconds>
		(std::chrono::system_clock::now() - startTime);

	cout << "Runtime:\t"
		<< std::fixed << std::setprecision(3) << elapsed.count() / 1000.0
		<< "s\n" 
		<< "-------------------------------------" << endl;

    return 0;
}